

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astSequenceNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  size_t sVar1;
  size_t local_80;
  size_t i;
  size_t expressionCount;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_16_2_d26a743c gcFrame;
  sysbvm_astSequenceNode_t **sequenceNode;
  sysbvm_functionBytecodeDirectCompiler_t **compiler;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  memset(&gcFrameRecord.roots,0,0x10);
  memset(&expressionCount,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&expressionCount);
  sVar1 = sysbvm_array_getSize(*(sysbvm_tuple_t *)(*arguments + 0x30));
  gcFrame.expressionNode = 0;
  if (sVar1 == 0) {
    gcFrame.expressionNode =
         sysbvm_functionBytecodeAssembler_addLiteral
                   (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),0x2f);
  }
  for (local_80 = 0; local_80 < sVar1; local_80 = local_80 + 1) {
    gcFrameRecord.roots =
         (sysbvm_tuple_t *)sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x30),local_80);
    gcFrame.expressionNode =
         sysbvm_functionBytecodeDirectCompiler_compileASTNode
                   (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                    (sysbvm_tuple_t)gcFrameRecord.roots);
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&expressionCount);
  return gcFrame.expressionNode;
}

Assistant:

static sysbvm_tuple_t sysbvm_astSequenceNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astSequenceNode_t **sequenceNode = (sysbvm_astSequenceNode_t**)node;
    struct {
        sysbvm_tuple_t expressionNode;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    size_t expressionCount = sysbvm_array_getSize((*sequenceNode)->expressions);
    gcFrame.result = SYSBVM_NULL_TUPLE;
    if(expressionCount == 0)
        gcFrame.result = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_VOID_TUPLE);

    for(size_t i = 0; i < expressionCount; ++i)
    {
        gcFrame.expressionNode = sysbvm_array_at((*sequenceNode)->expressions, i);
        gcFrame.result = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, gcFrame.expressionNode);
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}